

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

cram_block * cram_read_block(cram_fd *fd)

{
  uint uVar1;
  byte bVar2;
  cram_block_method cVar3;
  cram_content_type cVar4;
  int iVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  byte bVar9;
  cram_block *__ptr;
  uchar *buffer;
  size_t sVar8;
  byte bVar10;
  byte bVar11;
  long lVar12;
  byte *pbVar13;
  uchar *puVar14;
  size_t __size;
  long lStack_b0;
  uchar dat [100];
  
  __ptr = (cram_block *)malloc(0x40);
  if (__ptr == (cram_block *)0x0) {
    return (cram_block *)0x0;
  }
  cVar3 = hgetc(fd->fp);
  __ptr->method = cVar3;
  if (cVar3 != ERROR) {
    cVar4 = hgetc(fd->fp);
    __ptr->content_type = cVar4;
    if ((cVar4 != CT_ERROR) && (iVar5 = itf8_decode(fd,&__ptr->content_id), iVar5 != -1)) {
      iVar5 = itf8_decode(fd,&__ptr->comp_size);
      if (iVar5 != -1) {
        iVar5 = itf8_decode(fd,&__ptr->uncomp_size);
        if (iVar5 != -1) {
          cVar3 = __ptr->method;
          if (cVar3 == RAW) {
            iVar5 = __ptr->uncomp_size;
          }
          else {
            iVar5 = __ptr->comp_size;
          }
          __size = (size_t)iVar5;
          __ptr->alloc = __size;
          buffer = (uchar *)malloc(__size);
          __ptr->data = buffer;
          if (buffer != (uchar *)0x0) {
            sVar8 = hread(fd->fp,buffer,__size);
            if (sVar8 == __size) {
              if (fd->version < 0x300) {
LAB_00124a50:
                __ptr->orig_method = cVar3;
                __ptr->idx = 0;
                __ptr->byte = 0;
                __ptr->bit = 7;
                return __ptr;
              }
              iVar5 = int32_decode(fd,(int32_t *)&__ptr->crc32);
              if (iVar5 == -1) goto LAB_00124844;
              cVar3 = __ptr->method;
              dat[0] = (uchar)cVar3;
              dat[1] = (uchar)__ptr->content_type;
              uVar1 = __ptr->content_id;
              bVar2 = (byte)uVar1;
              if (uVar1 < 0x80) {
                lVar12 = 1;
                dat[2] = bVar2;
              }
              else {
                bVar9 = (byte)(uVar1 >> 8);
                if (uVar1 < 0x4000) {
                  lVar12 = 2;
                  dat[2] = bVar9 | 0x80;
                  dat[3] = bVar2;
                }
                else {
                  dat[3] = (uchar)(uVar1 >> 0x10);
                  if (uVar1 < 0x200000) {
                    lVar12 = 3;
                    dat[2] = dat[3] | 0xc0;
                    dat[3] = bVar9;
                    dat[4] = bVar2;
                  }
                  else {
                    bVar10 = (byte)(uVar1 >> 0x18);
                    if (uVar1 < 0x10000000) {
                      lVar12 = 4;
                      dat[2] = bVar10 | 0xe0;
                      dat[4] = bVar9;
                      dat[5] = bVar2;
                    }
                    else {
                      lVar12 = 5;
                      dat[2] = bVar10 >> 4 | 0xf0;
                      dat[3] = (uchar)(uVar1 >> 0x14);
                      dat[4] = (uchar)(uVar1 >> 0xc);
                      dat[5] = (uchar)(uVar1 >> 4);
                      dat[6] = bVar2 & 0xf;
                    }
                  }
                }
              }
              pbVar13 = dat + lVar12 + 2;
              uVar1 = __ptr->comp_size;
              bVar2 = (byte)uVar1;
              if (uVar1 < 0x80) {
                *pbVar13 = bVar2;
                lStack_b0 = 1;
              }
              else {
                bVar9 = (byte)(uVar1 >> 8);
                if (uVar1 < 0x4000) {
                  *pbVar13 = bVar9 | 0x80;
                  dat[lVar12 + 3] = bVar2;
                  lStack_b0 = 2;
                }
                else {
                  bVar10 = (byte)(uVar1 >> 0x10);
                  if (uVar1 < 0x200000) {
                    *pbVar13 = bVar10 | 0xc0;
                    dat[lVar12 + 3] = bVar9;
                    dat[lVar12 + 4] = bVar2;
                    lStack_b0 = 3;
                  }
                  else {
                    bVar11 = (byte)(uVar1 >> 0x18);
                    if (uVar1 < 0x10000000) {
                      *pbVar13 = bVar11 | 0xe0;
                      dat[lVar12 + 3] = bVar10;
                      dat[lVar12 + 4] = bVar9;
                      dat[lVar12 + 5] = bVar2;
                      lStack_b0 = 4;
                    }
                    else {
                      *pbVar13 = bVar11 >> 4 | 0xf0;
                      dat[lVar12 + 3] = (uchar)(uVar1 >> 0x14);
                      dat[lVar12 + 4] = (uchar)(uVar1 >> 0xc);
                      dat[lVar12 + 5] = (uchar)(uVar1 >> 4);
                      dat[lVar12 + 6] = bVar2 & 0xf;
                      lStack_b0 = 5;
                    }
                  }
                }
              }
              pbVar13 = pbVar13 + lStack_b0;
              uVar1 = __ptr->uncomp_size;
              bVar2 = (byte)uVar1;
              if (uVar1 < 0x80) {
                iVar5 = 1;
                *pbVar13 = bVar2;
              }
              else {
                bVar9 = (byte)(uVar1 >> 8);
                if (uVar1 < 0x4000) {
                  *pbVar13 = bVar9 | 0x80;
                  pbVar13[1] = bVar2;
                  iVar5 = 2;
                }
                else {
                  bVar10 = (byte)(uVar1 >> 0x10);
                  if (uVar1 < 0x200000) {
                    *pbVar13 = bVar10 | 0xc0;
                    pbVar13[1] = bVar9;
                    pbVar13[2] = bVar2;
                    iVar5 = 3;
                  }
                  else {
                    bVar11 = (byte)(uVar1 >> 0x18);
                    if (uVar1 < 0x10000000) {
                      *pbVar13 = bVar11 | 0xe0;
                      pbVar13[1] = bVar10;
                      pbVar13[2] = bVar9;
                      pbVar13[3] = bVar2;
                      iVar5 = 4;
                    }
                    else {
                      *pbVar13 = bVar11 >> 4 | 0xf0;
                      pbVar13[1] = (byte)(uVar1 >> 0x14);
                      pbVar13[2] = (byte)(uVar1 >> 0xc);
                      pbVar13[3] = (byte)(uVar1 >> 4);
                      pbVar13[4] = bVar2 & 0xf;
                      iVar5 = 5;
                    }
                  }
                }
              }
              uVar6 = crc32(0,dat,((int)pbVar13 + iVar5) - (int)dat);
              buffer = __ptr->data;
              puVar14 = "";
              if (buffer != (uchar *)0x0) {
                puVar14 = buffer;
              }
              uVar7 = crc32(uVar6,puVar14,(int)__ptr->alloc);
              if (__ptr->crc32 == uVar7) goto LAB_00124a50;
              fwrite("Block CRC32 failure\n",0x14,1,_stderr);
            }
            free(buffer);
          }
        }
      }
    }
  }
LAB_00124844:
  free(__ptr);
  return (cram_block *)0x0;
}

Assistant:

cram_block *cram_read_block(cram_fd *fd) {
    cram_block *b = malloc(sizeof(*b));
    if (!b)
	return NULL;

    //fprintf(stderr, "Block at %d\n", (int)ftell(fd->fp));

    if (-1 == (b->method      = hgetc(fd->fp))) { free(b); return NULL; }
    if (-1 == (b->content_type= hgetc(fd->fp))) { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->content_id))  { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->comp_size))   { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->uncomp_size)) { free(b); return NULL; }

    //    fprintf(stderr, "  method %d, ctype %d, cid %d, csize %d, ucsize %d\n",
    //	    b->method, b->content_type, b->content_id, b->comp_size, b->uncomp_size);

    if (b->method == RAW) {
	b->alloc = b->uncomp_size;
	if (!(b->data = malloc(b->uncomp_size))){ free(b); return NULL; }
	if (b->uncomp_size != hread(fd->fp, b->data, b->uncomp_size)) {
	    free(b->data);
	    free(b);
	    return NULL;
	}
    } else {
	b->alloc = b->comp_size;
	if (!(b->data = malloc(b->comp_size)))  { free(b); return NULL; }
	if (b->comp_size != hread(fd->fp, b->data, b->comp_size)) {
	    free(b->data);
	    free(b);
	    return NULL;
	}
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	unsigned char dat[100], *cp = dat;;
	uint32_t crc;

	
	if (-1 == int32_decode(fd, (int32_t *)&b->crc32)) {
	    free(b);
	    return NULL;
	}

	*cp++ = b->method;
	*cp++ = b->content_type;
	cp += itf8_put(cp, b->content_id);
	cp += itf8_put(cp, b->comp_size);
	cp += itf8_put(cp, b->uncomp_size);
	crc = crc32(0L, dat, cp-dat);
	crc = crc32(crc, b->data ? b->data : (uc *)"", b->alloc);

	if (crc != b->crc32) {
	    fprintf(stderr, "Block CRC32 failure\n");
	    free(b->data);
	    free(b);
	    return NULL;
	}
    }

    b->orig_method = b->method;
    b->idx = 0;
    b->byte = 0;
    b->bit = 7; // MSB

    return b;
}